

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> * __thiscall
math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
operator/=(uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *other)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  iterator pvVar4;
  uint *first;
  undefined1 local_68 [8];
  local_unsigned_wide_type b;
  local_unsigned_wide_type a;
  undefined1 local_30 [6];
  bool denom_was_neg;
  bool numer_was_neg;
  uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *local_18;
  uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *other_local;
  uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this_local;
  
  local_18 = other;
  other_local = this;
  if (this == other) {
    pvVar3 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
             front((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    *pvVar3 = 1;
    pvVar4 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
             begin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                   this);
    first = detail::advance_and_point<unsigned_int*,unsigned_int>(pvVar4,1);
    pvVar4 = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::end
                       ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         *)this);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(first,pvVar4,0);
  }
  else {
    bVar1 = is_zero(other);
    if (bVar1) {
      limits_helper_max<false>();
      operator=(this,(uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                     local_30);
      ~uintwide_t((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_30)
      ;
    }
    else {
      bVar1 = is_neg<false>(this,(enable_if_t<(_false),_int> *)0x0);
      bVar2 = is_neg<false>(local_18,(enable_if_t<(_false),_int> *)0x0);
      if ((bVar1) || (bVar2)) {
        uintwide_t((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                   &b.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems,this);
        uintwide_t((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_68
                   ,local_18);
        if (bVar1) {
          negate((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                 &b.values.
                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                  .elems);
        }
        if (bVar2) {
          negate((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_68);
        }
        eval_divide_knuth((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                          &b.values.
                           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                           .elems,(uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                   *)local_68,
                          (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                          0x0);
        if (bVar1 != bVar2) {
          negate((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                 &b.values.
                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                  .elems);
        }
        detail::fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_>::operator=
                  (&this->values,
                   (fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_> *)
                   &b.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems);
        ~uintwide_t((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                    local_68);
        ~uintwide_t((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                    &b.values.
                     super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                     .elems);
      }
      else {
        eval_divide_knuth(this,local_18,
                          (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                          0x0);
      }
    }
  }
  return this;
}

Assistant:

constexpr auto operator/=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        values.front() = static_cast<limb_type>(UINT8_C(1));

        detail::fill_unsafe(detail::advance_and_point(values.begin(), 1U), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else if(other.is_zero())
      {
        static_cast<void>(operator=(limits_helper_max<IsSigned>()));
      }
      else
      {
        // Unary division function.

        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          a.eval_divide_knuth(b);

          if(numer_was_neg != denom_was_neg) { a.negate(); }

          values = a.values;
        }
        else
        {
          eval_divide_knuth(other);
        }
      }

      return *this;
    }